

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject_group(Group *this,View *view)

{
  lock_guard<std::mutex> c;
  bool bVar1;
  uint32_t uVar2;
  mapped_type *this_00;
  Group *pGVar3;
  mapped_type *pmVar4;
  _Mem *this_01;
  UpdateJob *this_02;
  Group *this_03;
  uint64_t uVar5;
  float fVar6;
  float fVar7;
  Group *local_40 [3];
  uint64_t local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  View *view_local;
  Group *this_local;
  
  guard._M_device = (mutex_type *)view;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex);
  c._M_device = guard._M_device;
  local_28 = View::get_oid((View *)guard._M_device);
  this_00 = std::
            unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
            ::operator[](&this->group_views,&local_28);
  core::P<r_exec::View>::operator=(this_00,(View *)c._M_device);
  fVar6 = get_c_sln(this);
  fVar7 = get_c_sln_thr(this);
  if (fVar7 < fVar6) {
    fVar6 = View::get_sln((View *)guard._M_device);
    fVar7 = get_sln_thr(this);
    if (fVar7 < fVar6) {
      fVar6 = View::get_vis((View *)guard._M_device);
      fVar7 = get_vis_thr(this);
      if (fVar7 < fVar6) {
        bVar1 = View::get_cov((View *)guard._M_device);
        pGVar3 = core::P::operator_cast_to_Group_
                           ((P *)&((guard._M_device)->super___mutex_base)._M_mutex.__data.__list.
                                  __next);
        local_40[0] = this;
        pmVar4 = std::
                 unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
                 ::operator[](&pGVar3->viewing_groups,local_40);
        *pmVar4 = bVar1;
      }
      inject_reduction_jobs(this,(View *)guard._M_device);
    }
  }
  pGVar3 = core::P::operator_cast_to_Group_
                     ((P *)&((guard._M_device)->super___mutex_base)._M_mutex.__data.__list.__next);
  uVar2 = get_upr(pGVar3);
  if (uVar2 != 0) {
    this_01 = _Mem::Get();
    this_02 = (UpdateJob *)operator_new(0x28);
    pGVar3 = core::P::operator_cast_to_Group_
                       ((P *)&((guard._M_device)->super___mutex_base)._M_mutex.__data.__list.__next)
    ;
    this_03 = core::P::operator_cast_to_Group_
                        ((P *)&((guard._M_device)->super___mutex_base)._M_mutex.__data.__list.__next
                        );
    uVar5 = (*Now)();
    uVar5 = get_next_upr_time(this_03,uVar5);
    UpdateJob::UpdateJob(this_02,pGVar3,uVar5);
    _Mem::pushTimeJob(this_01,(TimeJob *)this_02);
  }
  notifyNew(this,(View *)guard._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Group::inject_group(View *view)
{
    std::lock_guard<std::mutex> guard(mutex);
    group_views[view->get_oid()] = view;

    if (get_c_sln() > get_c_sln_thr() && view->get_sln() > get_sln_thr()) { // group is c-salient and view is salient.
        if (view->get_vis() > get_vis_thr()) { // new visible group in a c-active and c-salient host.
            ((Group *)view->object)->viewing_groups[this] = view->get_cov();
        }

        inject_reduction_jobs(view);
    }

    if (((Group *)view->object)->get_upr() > 0) { // inject the next update job for the group.
        _Mem::Get()->pushTimeJob(new UpdateJob((Group *)view->object, ((Group *)view->object)->get_next_upr_time(Now())));
    }

    notifyNew(view);
}